

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

void __thiscall cmFileCopier::cmFileCopier(cmFileCopier *this,cmExecutionStatus *status,char *name)

{
  cmMakefile *pcVar1;
  char *name_local;
  cmExecutionStatus *status_local;
  cmFileCopier *this_local;
  
  this->_vptr_cmFileCopier = (_func_int **)&PTR__cmFileCopier_00f4eed0;
  this->Status = status;
  pcVar1 = cmExecutionStatus::GetMakefile(status);
  this->Makefile = pcVar1;
  this->Name = name;
  this->Always = false;
  cmFileTimeCache::cmFileTimeCache(&this->FileTimes);
  this->MatchlessFiles = true;
  this->FilePermissions = 0;
  this->DirPermissions = 0;
  std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>::vector
            (&this->MatchRules);
  this->CurrentMatchRule = (MatchRule *)0x0;
  this->UseGivenPermissionsFile = false;
  this->UseGivenPermissionsDir = false;
  this->UseSourcePermissions = true;
  this->FollowSymlinkChain = false;
  std::__cxx11::string::string((string *)&this->Destination);
  std::__cxx11::string::string((string *)&this->FilesFromDir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Files);
  this->Doing = 0;
  return;
}

Assistant:

cmFileCopier::cmFileCopier(cmExecutionStatus& status, const char* name)
  : Status(status)
  , Makefile(&status.GetMakefile())
  , Name(name)
{
}